

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O2

void __thiscall
Assimp::glTFExporter::GetMatColorOrTex
          (glTFExporter *this,aiMaterial *mat,TexProperty *prop,char *propName,int type,int idx,
          aiTextureType tt)

{
  _Rb_tree_color _Var1;
  Asset *pAVar2;
  Texture *pTVar3;
  aiTexture **ppaVar4;
  aiTexture *paVar5;
  glTFExporter *pgVar6;
  uint uVar7;
  aiReturn aVar8;
  int iVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  Ref<glTF::Texture> RVar12;
  Ref<glTF::Image> RVar13;
  allocator local_4d9;
  glTFExporter *local_4d8;
  mapped_type local_4cc;
  string mimeType;
  string imgId;
  string path;
  aiColor4D col;
  string texId;
  aiString tex;
  
  tex.length = 0;
  tex.data[0] = '\0';
  local_4d8 = this;
  memset(tex.data + 1,0x1b,0x3ff);
  col.r = 0.0;
  col.g = 0.0;
  col.b = 0.0;
  col.a = 0.0;
  uVar7 = aiGetMaterialTextureCount(mat,tt);
  if ((uVar7 != 0) &&
     (aVar8 = aiGetMaterialString(mat,"$tex.file",tt,0,&tex), aVar8 == aiReturn_SUCCESS)) {
    std::__cxx11::string::string((string *)&path,tex.data,(allocator *)&texId);
    pgVar6 = local_4d8;
    if (path._M_string_length != 0) {
      if ((*path._M_dataplus._M_p == '*') ||
         (iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::find(&(local_4d8->mTexturesByPath)._M_t,&path),
         (_Rb_tree_header *)iVar10._M_node ==
         &(pgVar6->mTexturesByPath)._M_t._M_impl.super__Rb_tree_header)) {
        if ((prop->texture).vector ==
            (vector<glTF::Texture_*,_std::allocator<glTF::Texture_*>_> *)0x0) {
          pAVar2 = (local_4d8->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          std::__cxx11::string::string((string *)&imgId,"",(allocator *)&mimeType);
          glTF::Asset::FindUniqueID(&texId,pAVar2,&imgId,"texture");
          std::__cxx11::string::~string((string *)&imgId);
          pgVar6 = local_4d8;
          RVar12 = glTF::LazyDict<glTF::Texture>::Create
                             (&((local_4d8->mAsset).
                                super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                               ->textures,texId._M_dataplus._M_p);
          (prop->texture).vector = RVar12.vector;
          local_4cc = RVar12.index;
          (prop->texture).index = local_4cc;
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::operator[](&pgVar6->mTexturesByPath,&path);
          *pmVar11 = local_4cc;
          pAVar2 = (pgVar6->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          std::__cxx11::string::string((string *)&mimeType,"",&local_4d9);
          glTF::Asset::FindUniqueID(&imgId,pAVar2,&mimeType,"image");
          std::__cxx11::string::~string((string *)&mimeType);
          RVar13 = glTF::LazyDict<glTF::Image>::Create
                             (&((local_4d8->mAsset).
                                super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                               ->images,imgId._M_dataplus._M_p);
          pTVar3 = (((prop->texture).vector)->
                   super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[(prop->texture).index];
          (pTVar3->source).vector = RVar13.vector;
          *(uint *)((long)&pTVar3->source + 8) = RVar13.index;
          if (*path._M_dataplus._M_p == '*') {
            ppaVar4 = local_4d8->mScene->mTextures;
            iVar9 = atoi(path._M_dataplus._M_p + 1);
            paVar5 = ppaVar4[iVar9];
            pTVar3 = (((prop->texture).vector)->
                     super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[(prop->texture).index];
            glTF::Image::SetData
                      (*(Image **)
                        (*(long *)(pTVar3->source).vector +
                        (ulong)*(uint *)((long)&pTVar3->source + 8) * 8),&paVar5->pcData->b,
                       (ulong)paVar5->mWidth,
                       (local_4d8->mAsset).
                       super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
            if (paVar5->achFormatHint[0] != '\0') {
              std::__cxx11::string::string((string *)&mimeType,"image/",&local_4d9);
              bcmp(paVar5->achFormatHint,"jpg",3);
              std::__cxx11::string::append((char *)&mimeType);
              pTVar3 = (((prop->texture).vector)->
                       super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>).
                       _M_impl.super__Vector_impl_data._M_start[(prop->texture).index];
              std::__cxx11::string::_M_assign
                        ((string *)
                         (*(long *)(*(long *)(pTVar3->source).vector +
                                   (ulong)*(uint *)((long)&pTVar3->source + 8) * 8) + 0x78));
              std::__cxx11::string::~string((string *)&mimeType);
            }
          }
          else {
            pTVar3 = (((prop->texture).vector)->
                     super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[(prop->texture).index];
            std::__cxx11::string::_M_assign
                      ((string *)
                       (*(long *)(*(long *)(pTVar3->source).vector +
                                 (ulong)*(uint *)((long)&pTVar3->source + 8) * 8) + 0x48));
          }
          GetTexSampler(local_4d8,mat,prop);
          std::__cxx11::string::~string((string *)&imgId);
          std::__cxx11::string::~string((string *)&texId);
        }
      }
      else {
        _Var1 = iVar10._M_node[2]._M_color;
        (prop->texture).vector =
             &(((local_4d8->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->textures).mObjs;
        (prop->texture).index = _Var1;
      }
    }
    std::__cxx11::string::~string((string *)&path);
  }
  aVar8 = aiGetMaterialColor(mat,propName,type,idx,&col);
  if (aVar8 == aiReturn_SUCCESS) {
    prop->color[0] = col.r;
    prop->color[1] = col.g;
    prop->color[2] = col.b;
    prop->color[3] = col.a;
  }
  return;
}

Assistant:

void glTFExporter::GetMatColorOrTex(const aiMaterial* mat, glTF::TexProperty& prop, const char* propName, int type, int idx, aiTextureType tt)
{
    aiString tex;
    aiColor4D col;
    if (mat->GetTextureCount(tt) > 0) {
        if (mat->Get(AI_MATKEY_TEXTURE(tt, 0), tex) == AI_SUCCESS) {
            std::string path = tex.C_Str();

            if (path.size() > 0) {
                if (path[0] != '*') {
                    std::map<std::string, unsigned int>::iterator it = mTexturesByPath.find(path);
                    if (it != mTexturesByPath.end()) {
                        prop.texture = mAsset->textures.Get(it->second);
                    }
                }

                if (!prop.texture) {
                    std::string texId = mAsset->FindUniqueID("", "texture");
                    prop.texture = mAsset->textures.Create(texId);
                    mTexturesByPath[path] = prop.texture.GetIndex();

                    std::string imgId = mAsset->FindUniqueID("", "image");
                    prop.texture->source = mAsset->images.Create(imgId);

                    if (path[0] == '*') { // embedded
                        aiTexture* tex = mScene->mTextures[atoi(&path[1])];

                        uint8_t* data = reinterpret_cast<uint8_t*>(tex->pcData);
                        prop.texture->source->SetData(data, tex->mWidth, *mAsset);

                        if (tex->achFormatHint[0]) {
                            std::string mimeType = "image/";
                            mimeType += (memcmp(tex->achFormatHint, "jpg", 3) == 0) ? "jpeg" : tex->achFormatHint;
                            prop.texture->source->mimeType = mimeType;
                        }
                    }
                    else {
                        prop.texture->source->uri = path;
                    }

                    GetTexSampler(mat, prop);
                }
            }
        }
    }

    if (mat->Get(propName, type, idx, col) == AI_SUCCESS) {
        prop.color[0] = col.r; prop.color[1] = col.g; prop.color[2] = col.b; prop.color[3] = col.a;
    }
}